

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::ui_switch_state(Application *this)

{
  element_type *peVar1;
  LoaderThread *this_00;
  bool bVar2;
  
  peVar1 = (this->m_path_tracer_thread).
           super___shared_ptr<PathTracerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->m_viewer_thread)._M_id._M_thread == 0 &&
      (peVar1->m_path_tracer_thread)._M_id._M_thread == 0) {
    this_00 = (this->m_loader_thread).super___shared_ptr<LoaderThread,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if ((this_00->m_thread)._M_id._M_thread == 0) {
      if ((((this->m_octree).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        this->m_ui_state = kEmpty;
      }
      else {
        this->m_ui_state = kOctreeTracer;
      }
    }
    else {
      this->m_ui_state = kLoading;
      bVar2 = LoaderThread::TryJoin(this_00);
      if (bVar2) {
        this->m_ui_state =
             (uint)((((this->m_octree).super___shared_ptr<Octree,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     )->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr != (element_type *)0x0);
      }
    }
  }
  else {
    this->m_ui_state = kPathTracing;
  }
  return;
}

Assistant:

void Application::ui_switch_state() {
	if (m_path_tracer_thread->IsRunning()) {
		m_ui_state = UIStates::kPathTracing;
	} else if (m_loader_thread->IsRunning()) {
		m_ui_state = UIStates::kLoading;

		if (m_loader_thread->TryJoin()) {
			m_ui_state = m_octree->Empty() ? UIStates::kEmpty : UIStates::kOctreeTracer;
		}
	} else if (m_octree->Empty())
		m_ui_state = UIStates::kEmpty;
	else {
		m_ui_state = UIStates::kOctreeTracer;
	}
}